

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O3

void Js::ProfilingHelpers::ProfiledStElem_FastPath
               (JavascriptArray *array,Var varIndex,Var value,ScriptContext *scriptContext,
               PropertyOperationFlags flags,StElemInfo *stElemInfo)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  SparseArraySegmentBase *pSVar5;
  uint32 offset;
  uint offset_00;
  
  if (array == (JavascriptArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x196,"(array)","array");
    if (!bVar3) goto LAB_00af5ac0;
    *puVar4 = 0;
  }
  if (varIndex == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x197,"(varIndex)","varIndex");
    if (!bVar3) goto LAB_00af5ac0;
    *puVar4 = 0;
  }
  if (value == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x198,"(value)","value");
    if (!bVar3) goto LAB_00af5ac0;
    *puVar4 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x199,"(scriptContext)","scriptContext");
    if (!bVar3) goto LAB_00af5ac0;
    *puVar4 = 0;
  }
  bVar3 = JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x19a,
                                "(!JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext))"
                                ,
                                "!JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext)"
                               );
    if (!bVar3) goto LAB_00af5ac0;
    *puVar4 = 0;
  }
  if (((ulong)varIndex & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)varIndex & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)varIndex & 0xffff000000000000) != 0x1000000000000) goto LAB_00af5a8e;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00af5ac0;
    *puVar4 = 0;
  }
  if (((ulong)varIndex & 0x1ffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00af5ac0;
    *puVar4 = 0;
  }
  offset_00 = (uint)varIndex;
  if (-1 < (int)offset_00) {
    if (stElemInfo != (StElemInfo *)0x0) {
      pSVar5 = (array->head).ptr;
      if (pSVar5->left != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                    ,0x1ad,"(head->left == 0)","head->left == 0");
        if (!bVar3) {
LAB_00af5ac0:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      if (pSVar5->length <= offset_00) {
        bVar1 = (stElemInfo->field_2).bits;
        (stElemInfo->field_2).bits = bVar1 | 0x10;
        if ((array->super_ArrayObject).length <= offset_00) {
          (stElemInfo->field_2).bits = bVar1 | 0x30;
        }
      }
      if (offset_00 < pSVar5->size) {
        JavascriptArray::DirectProfiledSetItemInHeadSegmentAt<void*>
                  (array,offset_00,value,stElemInfo);
        return;
      }
    }
    pSVar5 = JavascriptArray::GetLastUsedSegment(array);
    if (((pSVar5 != (SparseArraySegmentBase *)0x0) &&
        (offset = offset_00 - pSVar5->left, pSVar5->left <= offset_00)) && (offset < pSVar5->size))
    {
      JavascriptArray::DirectSetItemInLastUsedSegmentAt<void*>(array,offset,value);
      return;
    }
  }
LAB_00af5a8e:
  if (stElemInfo != (StElemInfo *)0x0) {
    (stElemInfo->field_2).bits = (stElemInfo->field_2).bits | 8;
  }
  JavascriptOperators::OP_SetElementI(array,varIndex,value,scriptContext,flags);
  return;
}

Assistant:

void ProfilingHelpers::ProfiledStElem_FastPath(
        JavascriptArray *const array,
        const Var varIndex,
        const Var value,
        ScriptContext *const scriptContext,
        const PropertyOperationFlags flags,
        StElemInfo *const stElemInfo)
    {
        Assert(array);
        Assert(varIndex);
        Assert(value);
        Assert(scriptContext);
        Assert(!JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext));

        do // while(false)
        {
            if (!TaggedInt::Is(varIndex))
            {
                break;
            }

            int32 index = TaggedInt::ToInt32(varIndex);

            if (index < 0)
            {
                break;
            }

            if(stElemInfo)
            {
                SparseArraySegmentBase *const head = array->GetHead();
                Assert(head->left == 0);
                const uint32 offset = index;
                if(offset >= head->length)
                {
                    stElemInfo->storedOutsideHeadSegmentBounds = true;
                    if(offset >= array->GetLength())
                    {
                        stElemInfo->storedOutsideArrayBounds = true;
                    }
                }

                if(offset < head->size)
                {
                    array->DirectProfiledSetItemInHeadSegmentAt(offset, value, stElemInfo);
                    return;
                }
            }

            SparseArraySegment<Var>* lastUsedSeg = (SparseArraySegment<Var>*)array->GetLastUsedSegment();
            if (lastUsedSeg == NULL ||
                (uint32) index < lastUsedSeg->left)
            {
                break;
            }

            uint32 index2 = index - lastUsedSeg->left;

            if (index2 < lastUsedSeg->size)
            {
                // Successful fastpath
                array->DirectSetItemInLastUsedSegmentAt(index2, value);
                return;
            }
        } while(false);

        if(stElemInfo)
        {
            stElemInfo->neededHelperCall = true;
        }
        JavascriptOperators::OP_SetElementI(array, varIndex, value, scriptContext, flags);
    }